

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O2

exr_result_t DwaCompressor_compress(DwaCompressor *me)

{
  uint64_t *encbytes;
  uint8_t uVar1;
  int iVar2;
  CompressorScheme CVar3;
  exr_encode_pipeline_t *peVar4;
  undefined8 *__s;
  undefined8 *puVar5;
  ChannelData *pCVar6;
  CscChannelSet *pCVar7;
  exr_coding_channel_info_t *peVar8;
  uint8_t *puVar9;
  void *in;
  exr_result_t eVar10;
  int iVar11;
  exr_result_t eVar12;
  char *pcVar13;
  uint64_t uVar14;
  size_t sVar15;
  ulong uVar16;
  size_t out_bytes_avail;
  size_t sVar17;
  size_t sVar18;
  unsigned_short *toNonlinear;
  ulong uVar19;
  size_t c;
  ulong uVar20;
  int byte;
  int iVar21;
  long lVar22;
  size_t y;
  long lVar23;
  long lVar24;
  Classifier *me_00;
  uint8_t *puVar25;
  bool bVar26;
  void *local_2d0;
  uint8_t *local_2c8;
  uint8_t *local_2b0;
  size_t readHere;
  LossyDctEncoder enc;
  
  me->_channelRules = sDefaultChannelRules;
  me->_channelRuleCount = 0xf;
  readHere = 0;
  DwaCompressor_initializeBuffers(me,&readHere);
  sVar18 = readHere;
  peVar4 = me->_encode;
  eVar10 = 1;
  if ((0x57 < peVar4->compressed_alloc_size) &&
     (eVar10 = internal_encode_alloc_buffer
                         (peVar4,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar4->compressed_buffer,
                          &peVar4->compressed_alloc_size,readHere), eVar10 == 0)) {
    __s = (undefined8 *)me->_encode->compressed_buffer;
    memset(__s,0,me->_encode->compressed_alloc_size);
    if (sVar18 < 2) {
LAB_00107912:
      eVar10 = 1;
    }
    else {
      encbytes = __s + 3;
      local_2d0 = (void *)((long)__s + 0x5a);
      lVar24 = 2;
      for (uVar16 = 0; uVar16 < me->_channelRuleCount; uVar16 = uVar16 + 1) {
        lVar22 = (long)me->_numChannels + 1;
        lVar23 = 0;
        do {
          lVar22 = lVar22 + -1;
          if (lVar22 == 0) goto LAB_00107a16;
          puVar5 = *(undefined8 **)((long)(me->_channelData->_dctData)._dctData + lVar23 + -0x20);
          lVar23 = lVar23 + 0x240;
          pcVar13 = Classifier_find_suffix((char *)*puVar5);
          me_00 = me->_channelRules + uVar16;
          iVar11 = Classifier_match(me_00,pcVar13,(uint)*(ushort *)((long)puVar5 + 0x1a));
        } while (iVar11 == 0);
        uVar14 = Classifier_size(me_00);
        if (sVar18 < uVar14 + lVar24) goto LAB_00107912;
        pcVar13 = me_00->_suffix;
        sVar15 = strlen(pcVar13);
        memcpy(local_2d0,pcVar13,sVar15 + 1);
        *(byte *)((long)local_2d0 + sVar15 + 1) =
             ((char)(me_00->_cscIdx << 4) + ((byte)me_00->_scheme & 3) * '\x04' |
             me_00->_caseInsensitive & 1) + 0x10;
        *(char *)((long)local_2d0 + sVar15 + 2) = (char)me_00->_type;
        lVar24 = lVar24 + sVar15 + 3;
        local_2d0 = (void *)((long)local_2d0 + sVar15 + 3);
LAB_00107a16:
      }
      *(short *)(__s + 0xb) = (short)lVar24;
      uVar16 = lVar24 + 0x58;
      eVar10 = 1;
      if (uVar16 < me->_encode->compressed_alloc_size) {
        local_2c8 = me->_packedAcBuffer;
        local_2b0 = me->_packedDcBuffer;
        *__s = 2;
        __s[10] = (ulong)me->_acCompression;
        DwaCompressor_setupChannelData(me);
        iVar11 = me->_numChannels;
        lVar22 = (long)iVar11;
        lVar24 = 0xc;
        while (bVar26 = lVar22 != 0, lVar22 = lVar22 + -1, bVar26) {
          *(undefined4 *)((long)(me->_channelData->_dctData)._dctData + lVar24 + -0x20) = 0;
          lVar24 = lVar24 + 0x240;
        }
        puVar25 = (uint8_t *)me->_encode->packed_buffer;
        iVar21 = me->_min[1];
        while( true ) {
          eVar10 = 0;
          iVar2 = me->_max[1];
          if (iVar2 < iVar21) break;
          lVar24 = 0x20;
          for (uVar20 = 0; uVar20 < (ulong)(long)iVar11; uVar20 = uVar20 + 1) {
            lVar22 = *(long *)((long)(me->_channelData->_dctData)._dctData + lVar24 + -0x40);
            if (iVar21 % *(int *)(lVar22 + 0x14) == 0) {
              eVar10 = DctCoderChannelData_push_row
                                 ((DctCoderChannelData *)
                                  ((long)(me->_channelData->_dctData)._dctData + lVar24 + -0x20),
                                  puVar25);
              if (eVar10 != 0) {
                eVar10 = 1;
                if (iVar21 <= iVar2) {
                  return 1;
                }
                goto LAB_00107b13;
              }
              puVar25 = puVar25 + (long)*(char *)(lVar22 + 0x19) * (long)*(int *)(lVar22 + 0xc);
              iVar11 = me->_numChannels;
            }
            lVar24 = lVar24 + 0x240;
          }
          iVar21 = iVar21 + 1;
        }
LAB_00107b13:
        lVar24 = 8;
        for (uVar20 = 0; uVar20 < (ulong)(long)me->_numCscChannelSets; uVar20 = uVar20 + 1) {
          pCVar6 = me->_channelData;
          pCVar7 = me->_cscChannelSets;
          iVar11 = *(int *)((long)pCVar7->idx + lVar24 + -8);
          iVar21 = *(int *)((long)pCVar7->idx + lVar24 + -4);
          iVar2 = *(int *)((long)pCVar7->idx + lVar24);
          peVar8 = pCVar6[iVar11].chan;
          LossyDctEncoder_base_construct
                    (&enc,me->_dwaCompressionLevel / 100000.0,local_2c8,local_2b0,
                     dwaCompressorToNonlinear,peVar8->width,peVar8->height);
          enc._channel_encode_data_count = 3;
          enc._channel_encode_data[0] = &pCVar6[iVar11]._dctData;
          enc._channel_encode_data[1] = &pCVar6[iVar21]._dctData;
          enc._channel_encode_data[2] = &pCVar6[iVar2]._dctData;
          eVar10 = LossyDctEncoder_execute(&enc);
          __s[8] = __s[8] + (long)enc._numAcComp;
          __s[9] = __s[9] + (long)enc._numDcComp;
          pCVar6 = me->_channelData;
          pCVar6[*(int *)((long)pCVar7->idx + lVar24 + -8)].processed = 1;
          pCVar6[*(int *)((long)pCVar7->idx + lVar24 + -4)].processed = 1;
          pCVar6[*(int *)((long)pCVar7->idx + lVar24)].processed = 1;
          if (eVar10 != 0) {
            return 1;
          }
          local_2b0 = local_2b0 + (long)enc._numDcComp * 2;
          local_2c8 = local_2c8 + (long)enc._numAcComp * 2;
          lVar24 = lVar24 + 0xc;
          eVar10 = 0;
        }
        lVar24 = 0x210;
        for (uVar20 = 0; uVar20 < (ulong)(long)me->_numChannels; uVar20 = uVar20 + 1) {
          pCVar6 = me->_channelData;
          if (pCVar6[uVar20].processed == 0) {
            peVar8 = pCVar6[uVar20].chan;
            CVar3 = pCVar6[uVar20].compression;
            if (CVar3 == UNKNOWN) {
              sVar15 = (long)peVar8->bytes_per_element * (long)peVar8->width;
              for (uVar19 = 0; uVar19 < pCVar6[uVar20]._dctData._size; uVar19 = uVar19 + 1) {
                memcpy(pCVar6[uVar20].planarUncBufferEnd,pCVar6[uVar20]._dctData._rows[uVar19],
                       sVar15);
                pCVar6[uVar20].planarUncBufferEnd = pCVar6[uVar20].planarUncBufferEnd + sVar15;
              }
              __s[1] = __s[1] + pCVar6[uVar20].planarUncSize;
            }
            else if (CVar3 == LOSSY_DCT) {
              eVar10 = 0;
              toNonlinear = (uint16_t *)0x0;
              if (peVar8->p_linear == '\0') {
                toNonlinear = dwaCompressorToNonlinear;
              }
              LossyDctEncoder_base_construct
                        (&enc,me->_dwaCompressionLevel / 100000.0,local_2c8,local_2b0,toNonlinear,
                         peVar8->width,peVar8->height);
              enc._channel_encode_data_count = 1;
              enc._channel_encode_data[0] = &pCVar6[uVar20]._dctData;
              eVar12 = LossyDctEncoder_execute(&enc);
              __s[8] = __s[8] + (long)enc._numAcComp;
              __s[9] = __s[9] + (long)enc._numDcComp;
              if (eVar12 != 0) {
                return 1;
              }
              local_2c8 = local_2c8 + (long)enc._numAcComp * 2;
              local_2b0 = local_2b0 + (long)enc._numDcComp * 2;
            }
            else {
              if (CVar3 != RLE) {
                return 3;
              }
              for (uVar19 = 0; uVar19 < pCVar6[uVar20]._dctData._size; uVar19 = uVar19 + 1) {
                puVar25 = pCVar6[uVar20]._dctData._rows[uVar19];
                for (iVar11 = 0; iVar11 < peVar8->width; iVar11 = iVar11 + 1) {
                  for (lVar22 = 0; lVar22 < peVar8->bytes_per_element; lVar22 = lVar22 + 1) {
                    uVar1 = puVar25[lVar22];
                    puVar9 = *(uint8_t **)
                              ((long)(pCVar6->_dctData)._dctData + lVar22 * 8 + lVar24 + -0x20);
                    *(uint8_t **)((long)(pCVar6->_dctData)._dctData + lVar22 * 8 + lVar24 + -0x20) =
                         puVar9 + 1;
                    *puVar9 = uVar1;
                  }
                  puVar25 = puVar25 + lVar22;
                }
                __s[7] = __s[7] + (long)peVar8->width * (long)peVar8->bytes_per_element;
              }
            }
            pCVar6[uVar20].processed = 1;
          }
          lVar24 = lVar24 + 0x240;
        }
        sVar17 = __s[1];
        if (sVar17 != 0) {
          puVar25 = me->_planarUncBuffer[0];
          out_bytes_avail = exr_compress_max_buffer_size(sVar17);
          eVar10 = exr_compress_buffer(9,puVar25,sVar17,local_2d0,out_bytes_avail,(size_t *)&enc);
          if (eVar10 != 0) {
            return eVar10;
          }
          local_2d0 = (void *)((long)local_2d0 + enc._0_8_);
          __s[2] = enc._0_8_;
          uVar16 = uVar16 + enc._0_8_;
          eVar10 = 0;
        }
        uVar14 = __s[8];
        if (uVar14 != 0) {
          if (me->_acCompression == DEFLATE) {
            puVar25 = me->_packedAcBuffer;
            sVar18 = exr_compress_max_buffer_size(uVar14 * 2);
            eVar10 = exr_compress_buffer(9,puVar25,uVar14 * 2,local_2d0,sVar18,(size_t *)&enc);
            if (eVar10 != 0) {
              return eVar10;
            }
            *encbytes = enc._0_8_;
            uVar14 = enc._0_8_;
          }
          else {
            if (me->_acCompression != STATIC_HUFFMAN) {
              return 3;
            }
            eVar10 = internal_huf_compress
                               (encbytes,local_2d0,(long)__s + (sVar18 - (long)local_2d0),
                                (uint16_t *)me->_packedAcBuffer,uVar14,me->_encode->scratch_buffer_1
                                ,me->_encode->scratch_alloc_size_1);
            if (eVar10 == 4) {
              peVar4 = me->_encode;
              memcpy(peVar4->compressed_buffer,peVar4->packed_buffer,peVar4->packed_alloc_size);
              me->_encode->compressed_bytes = me->_encode->packed_alloc_size;
              return 0;
            }
            if (eVar10 != 0) {
              return eVar10;
            }
            uVar14 = *encbytes;
          }
          local_2d0 = (void *)((long)local_2d0 + uVar14);
          uVar16 = uVar16 + uVar14;
          eVar10 = 0;
        }
        if (__s[9] != 0) {
          sVar18 = __s[9] * 2;
          peVar4 = me->_encode;
          eVar10 = internal_encode_alloc_buffer
                             (peVar4,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar4->scratch_buffer_1,
                              &peVar4->scratch_alloc_size_1,sVar18);
          if (eVar10 != 0) {
            return eVar10;
          }
          internal_zip_deconstruct_bytes
                    ((uint8_t *)me->_encode->scratch_buffer_1,me->_packedDcBuffer,sVar18);
          iVar11 = me->_zipLevel;
          in = me->_encode->scratch_buffer_1;
          sVar17 = exr_compress_max_buffer_size(sVar18);
          eVar10 = exr_compress_buffer(iVar11,in,sVar18,local_2d0,sVar17,(size_t *)&enc);
          if (eVar10 != 0) {
            return eVar10;
          }
          __s[4] = enc._0_8_;
          local_2d0 = (void *)((long)local_2d0 + enc._0_8_);
          uVar16 = uVar16 + enc._0_8_;
          eVar10 = 0;
        }
        if (__s[7] != 0) {
          uVar14 = internal_rle_compress
                             (me->_rleBuffer,me->_rleBufferSize,me->_planarUncBuffer[2],__s[7]);
          __s[6] = uVar14;
          puVar25 = me->_rleBuffer;
          sVar18 = exr_compress_max_buffer_size(uVar14);
          eVar10 = exr_compress_buffer(9,puVar25,uVar14,local_2d0,sVar18,(size_t *)&enc);
          if (eVar10 != 0) {
            return eVar10;
          }
          __s[5] = enc._0_8_;
          local_2d0 = (void *)((long)local_2d0 + enc._0_8_);
          uVar16 = uVar16 + enc._0_8_;
          eVar10 = 0;
        }
        peVar4 = me->_encode;
        if (uVar16 == (long)local_2d0 - (long)peVar4->compressed_buffer) {
          if (uVar16 < peVar4->packed_bytes) {
            peVar4->compressed_bytes = uVar16;
          }
          else {
            memcpy(peVar4->compressed_buffer,peVar4->packed_buffer,peVar4->packed_bytes);
            me->_encode->compressed_bytes = me->_encode->packed_bytes;
          }
        }
        else {
          eVar10 = 0x17;
        }
      }
    }
  }
  return eVar10;
}

Assistant:

exr_result_t
DwaCompressor_compress (DwaCompressor* me)
{
    exr_result_t rv;
    uint8_t*     outPtr;
    uint64_t     outBufferSize = 0;
    uint64_t     nWritten      = 0;
    uint64_t     nAvail;
    int          fileVersion = 2;

    // Starting with 2, we write the channel
    // classification rules into the file
    if (fileVersion < 2)
    {
        me->_channelRules = sLegacyChannelRules;
        me->_channelRuleCount =
            sizeof (sLegacyChannelRules) / sizeof (Classifier);
    }
    else
    {
        me->_channelRules = sDefaultChannelRules;
        me->_channelRuleCount =
            sizeof (sDefaultChannelRules) / sizeof (Classifier);
    }

    size_t readHere = 0;
    rv = DwaCompressor_initializeBuffers (me, &readHere);
    outBufferSize = readHere;

    nAvail = me->_encode->compressed_alloc_size;
    if (nAvail < (NUM_SIZES_SINGLE * sizeof (uint64_t)))
        return EXR_ERR_OUT_OF_MEMORY;

    rv = internal_encode_alloc_buffer (
        me->_encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(me->_encode->compressed_buffer),
        &(me->_encode->compressed_alloc_size),
        outBufferSize);
    if (rv != EXR_ERR_SUCCESS) return rv;

    nAvail          = outBufferSize;
    uint64_t* sizes = (uint64_t*) me->_encode->compressed_buffer;

    //
    // Zero all the numbers in the chunk header
    //
    //    memset (sizes, 0, NUM_SIZES_SINGLE * sizeof (uint64_t));
    memset (sizes, 0, me->_encode->compressed_alloc_size);

#define OBIDX(x) (uint64_t*) (sizes + x)

    uint64_t* version                 = OBIDX (VERSION);
    uint64_t* unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    uint64_t* unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    uint64_t* acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    uint64_t* dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    uint64_t* rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    uint64_t* rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    uint64_t* rleRawSize              = OBIDX (RLE_RAW_SIZE);

    uint64_t* totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    uint64_t* totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    uint64_t* acCompression = OBIDX (AC_COMPRESSION);
    uint8_t*  packedAcEnd   = NULL;
    uint8_t*  packedDcEnd   = NULL;

    // Now write in the channel rules...
    outPtr = (uint8_t*) (sizes + NUM_SIZES_SINGLE);
    if (rv == EXR_ERR_SUCCESS && fileVersion >= 2)
    {
        rv = DwaCompressor_writeRelevantChannelRules (
            me, &outPtr, nAvail, &nWritten);
    }

    // post add this so we have a 0 value for the relevant channel
    // rules to fill up
    nWritten += NUM_SIZES_SINGLE * sizeof (uint64_t);

    if (rv != EXR_ERR_SUCCESS || nWritten >= me->_encode->compressed_alloc_size)
        return EXR_ERR_OUT_OF_MEMORY;

    uint8_t* outDataPtr   = outPtr;

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and dereferencing
    // a vector will not be a good thing to do.
    //

    if (me->_packedAcBuffer) packedAcEnd = me->_packedAcBuffer;
    if (me->_packedDcBuffer) packedDcEnd = me->_packedDcBuffer;

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;
    *acCompression = me->_acCompression;

    rv = DwaCompressor_setupChannelData (me);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //
    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        me->_channelData[c].processed = 0;
    }

    uint8_t* inDataPtr = (uint8_t*) me->_encode->packed_buffer;

    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
    {
        for (size_t c = 0; c < me->_numChannels; ++c)
        {
            ChannelData*               cd   = &(me->_channelData[c]);
            exr_coding_channel_info_t* chan = cd->chan;

            if ((y % chan->y_samples) != 0) continue;

            rv = DctCoderChannelData_push_row (&(cd->_dctData), inDataPtr);
            if (rv != EXR_ERR_SUCCESS) return rv;

            inDataPtr += chan->width * chan->bytes_per_element;
        }
    }

    //
    // Make a pass over all our CSC sets and try to encode them first
    //

    for (size_t csc = 0; csc < me->_numCscChannelSets; ++csc)
    {
        LossyDctEncoder enc;
        CscChannelSet*  cset = &(me->_cscChannelSets[csc]);

        rv = LossyDctEncoderCsc_construct (
            &enc,
            me->_dwaCompressionLevel / 100000.f,
            &(me->_channelData[cset->idx[0]]._dctData),
            &(me->_channelData[cset->idx[1]]._dctData),
            &(me->_channelData[cset->idx[2]]._dctData),
            packedAcEnd,
            packedDcEnd,
            dwaCompressorToNonlinear,
            me->_channelData[cset->idx[0]].chan->width,
            me->_channelData[cset->idx[0]].chan->height);

        if (rv == EXR_ERR_SUCCESS) rv = LossyDctEncoder_execute (&enc);

        *totalAcUncompressedCount = *totalAcUncompressedCount + enc._numAcComp;
        *totalDcUncompressedCount = *totalDcUncompressedCount + enc._numDcComp;

        packedAcEnd += enc._numAcComp * sizeof (uint16_t);
        packedDcEnd += enc._numDcComp * sizeof (uint16_t);

        me->_channelData[cset->idx[0]].processed = 1;
        me->_channelData[cset->idx[1]].processed = 1;
        me->_channelData[cset->idx[2]].processed = 1;

        LossyDctEncoder_destroy (&enc);
        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    for (size_t chan = 0; chan < me->_numChannels; ++chan)
    {
        ChannelData*               cd    = &(me->_channelData[chan]);
        exr_coding_channel_info_t* pchan = cd->chan;

        if (cd->processed) continue;

        switch (cd->compression)
        {
            case LOSSY_DCT:
                //
                // For LOSSY_DCT, treat this just like the CSC'd case,
                // but only operate on one channel
                //
                {
                    LossyDctEncoder       enc;
                    const unsigned short* nonlinearLut = NULL;

                    if (!pchan->p_linear)
                        nonlinearLut = dwaCompressorToNonlinear;

                    rv = LossyDctEncoder_construct (
                        &enc,
                        me->_dwaCompressionLevel / 100000.f,
                        &(cd->_dctData),
                        packedAcEnd,
                        packedDcEnd,
                        nonlinearLut,
                        pchan->width,
                        pchan->height);

                    if (rv == EXR_ERR_SUCCESS)
                        rv = LossyDctEncoder_execute (&enc);

                    *totalAcUncompressedCount =
                        *totalAcUncompressedCount + enc._numAcComp;
                    *totalDcUncompressedCount =
                        *totalDcUncompressedCount + enc._numDcComp;

                    packedAcEnd += enc._numAcComp * sizeof (uint16_t);
                    packedDcEnd += enc._numDcComp * sizeof (uint16_t);

                    LossyDctEncoder_destroy (&enc);
                    if (rv != EXR_ERR_SUCCESS) return rv;
                }
                break;

            case RLE: {
                //
                // For RLE, bash the bytes up so that the first bytes of each
                // pixel are contiguous, as are the second bytes, and so on.
                //
                DctCoderChannelData* dcd = &(cd->_dctData);
                for (size_t y = 0; y < dcd->_size; ++y)
                {
                    const uint8_t* row = dcd->_rows[y];

                    for (int x = 0; x < pchan->width; ++x)
                    {
                        for (int byte = 0; byte < pchan->bytes_per_element;
                             ++byte)
                        {
                            *cd->planarUncRleEnd[byte]++ = *row++;
                        }
                    }

                    *rleRawSize += pchan->width * pchan->bytes_per_element;
                }

                break;
            }

            case UNKNOWN:

                //
                // Otherwise, just copy data over verbatim
                //

                {
                    size_t scanlineSize =
                        pchan->width * pchan->bytes_per_element;
                    DctCoderChannelData* dcd = &(cd->_dctData);
                    for (size_t y = 0; y < dcd->_size; ++y)
                    {
                        memcpy (
                            cd->planarUncBufferEnd,
                            dcd->_rows[y],
                            scanlineSize);

                        cd->planarUncBufferEnd += scanlineSize;
                    }

                    *unknownUncompressedSize += cd->planarUncSize;
                }

                break;

            default: return EXR_ERR_INVALID_ARGUMENT;
        }

        cd->processed = DWA_CLASSIFIER_TRUE;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        size_t outSize;

        rv = exr_compress_buffer (
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_planarUncBuffer[UNKNOWN],
            *unknownUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*unknownUncompressedSize),
            &outSize);
        if (rv != EXR_ERR_SUCCESS)
        {
            return rv;
            //throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
        }

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
        nWritten += outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    {
        switch (me->_acCompression)
        {
            case STATIC_HUFFMAN: {
                size_t outDataSize =
                    outBufferSize -
                    (size_t) ((uintptr_t) outDataPtr - (uintptr_t) sizes);

                rv = internal_huf_compress (
                    acCompressedSize,
                    outDataPtr,
                    outDataSize,
                    (const uint16_t*) me->_packedAcBuffer,
                    *totalAcUncompressedCount,
                    me->_encode->scratch_buffer_1,
                    me->_encode->scratch_alloc_size_1);
                if (rv != EXR_ERR_SUCCESS)
                {
                    if (rv == EXR_ERR_ARGUMENT_OUT_OF_RANGE)
                    {
                        memcpy (
                            me->_encode->compressed_buffer,
                            me->_encode->packed_buffer,
                            me->_encode->packed_alloc_size);
                        me->_encode->compressed_bytes =
                            me->_encode->packed_alloc_size;
                        return EXR_ERR_SUCCESS;
                    }
                    return rv;
                    //throw IEX_NAMESPACE::InputExc (
                    //    "Data compression (HUF) failed.");
                }
                break;
            }

            case DEFLATE: {
                size_t sourceLen =
                    *totalAcUncompressedCount * sizeof (uint16_t);
                size_t destLen;

                rv = exr_compress_buffer (
                    9, // TODO: use default??? the old call to zlib had 9 hardcoded
                    me->_packedAcBuffer,
                    sourceLen,
                    outDataPtr,
                    exr_compress_max_buffer_size (sourceLen),
                    &destLen);
                if (rv != EXR_ERR_SUCCESS)
                {
                    return rv;
                    //throw IEX_NAMESPACE::InputExc (
                    //    "Data compression (zlib) failed.");
                }

                *acCompressedSize = destLen;
                break;
            }

            default:
                return EXR_ERR_INVALID_ARGUMENT;
                //assert (false);
        }

        outDataPtr += *acCompressedSize;
        nWritten += *acCompressedSize;
    }

    //
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        size_t compBytes;
        size_t uncompBytes = *totalDcUncompressedCount * sizeof (uint16_t);

        rv = internal_encode_alloc_buffer (
            me->_encode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(me->_encode->scratch_buffer_1),
            &(me->_encode->scratch_alloc_size_1),
            uncompBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        internal_zip_deconstruct_bytes (
            (uint8_t*) me->_encode->scratch_buffer_1,
            (const uint8_t*) me->_packedDcBuffer, uncompBytes);

        rv = exr_compress_buffer (
            me->_zipLevel,
            me->_encode->scratch_buffer_1,
            uncompBytes,
            outDataPtr,
            exr_compress_max_buffer_size (uncompBytes),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        *dcCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //

    if (*rleRawSize > 0)
    {
        *rleUncompressedSize = internal_rle_compress (
            me->_rleBuffer,
            me->_rleBufferSize,
            me->_planarUncBuffer[RLE],
            *rleRawSize);

        size_t compBytes;
        rv = exr_compress_buffer (
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_rleBuffer,
            *rleUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*rleUncompressedSize),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;
        //throw IEX_NAMESPACE::BaseExc ("Error compressing RLE'd data.");

        *rleCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // Flip the counters to XDR format
    //
    priv_from_native64 (sizes, NUM_SIZES_SINGLE);

    size_t dataBytes =
        (uintptr_t) outDataPtr - (uintptr_t) me->_encode->compressed_buffer;
    if (nWritten != dataBytes) { return EXR_ERR_CORRUPT_CHUNK; }

    if (nWritten >= me->_encode->packed_bytes)
    {
        memcpy (
            me->_encode->compressed_buffer,
            me->_encode->packed_buffer,
            me->_encode->packed_bytes);
        me->_encode->compressed_bytes = me->_encode->packed_bytes;
    }
    else { me->_encode->compressed_bytes = nWritten; }
    return rv;
}